

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

Logon * anon_unknown.dwarf_2926b4::createT11Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_218;
  FieldBase local_1c0;
  allocator<char> local_161;
  STRING local_160;
  DefaultApplVerID local_140;
  HeartBtInt local_e8;
  EncryptMethod local_80;
  undefined1 local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  Logon *logon;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIXT11::Logon::Logon(__return_storage_ptr__);
  FIX::EncryptMethod::EncryptMethod(&local_80,0);
  FIXT11::Logon::set(__return_storage_ptr__,&local_80);
  FIX::EncryptMethod::~EncryptMethod(&local_80);
  FIX::HeartBtInt::HeartBtInt(&local_e8,0x1e);
  FIXT11::Logon::set(__return_storage_ptr__,&local_e8);
  FIX::HeartBtInt::~HeartBtInt(&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"7",&local_161);
  FIX::DefaultApplVerID::DefaultApplVerID(&local_140,&local_160);
  FIXT11::Logon::set(__return_storage_ptr__,&local_140);
  FIX::DefaultApplVerID::~DefaultApplVerID(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  pHVar2 = FIXT11::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,local_24);
  pHVar2 = FIXT11::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_1c0,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_1c0,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_1c0);
  this = FIXT11::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_218,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_218,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_218);
  return __return_storage_ptr__;
}

Assistant:

FIXT11::Logon createT11Logon(const char *sender, const char *target, int seq) {
  FIXT11::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  logon.set(DefaultApplVerID("7"));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}